

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall dh::analysis::match(analysis *this,string *c)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  int iVar2;
  ostream *poVar3;
  bool bVar4;
  token local_58;
  
  token::getVal_abi_cxx11_
            (&local_58._val,
             (this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  __n = c->_M_string_length;
  if (__n == local_58._val._M_string_length) {
    if (__n == 0) {
      bVar4 = true;
    }
    else {
      iVar2 = bcmp((c->_M_dataplus)._M_p,local_58._val._M_dataplus._M_p,__n);
      bVar4 = iVar2 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  paVar1 = &local_58._val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._val._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._val._M_dataplus._M_p);
  }
  if (bVar4) {
    scanner::getToken(&local_58,&this->_tokens);
    token::operator=((this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._val._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._val._M_dataplus._M_p);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"[ERROR] Incompitable word: \"",0x1c);
  token::getVal_abi_cxx11_
            (&local_58._val,
             (this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_58._val._M_dataplus._M_p,
                      local_58._val._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" in line ",10);
  iVar2 = token::getLineno((this->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," expect token: \"",0x10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(c->_M_dataplus)._M_p,c->_M_string_length);
  std::operator<<(poVar3,"\"\n");
  std::__cxx11::string::~string((string *)&local_58);
  exit(1);
}

Assistant:

void analysis::match( ::std::string c)
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG IN Match] get " 
		<< tmp->getVal() 
		<< " need " 
		<< c 
		<< ::std::endl;
#endif
	if ( c == tmp->getVal())
	{
		*tmp = _tokens.getToken();
		return ;
	} else 
	{
		::std::cerr << "[ERROR] Incompitable word: \""
			<< tmp->getVal() 
			<< "\" in line "
			<< tmp->getLineno()
			<< " expect token: \""
			<< c
			<< "\"\n";
		::std::exit(1);
	}
}